

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestCase *pTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  string test_name;
  allocator local_91;
  Int32 local_90;
  Int32 local_8c;
  ReactionToSharding local_88;
  int local_84;
  UnitTestImpl *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_8c = -1;
  local_90 = -1;
  local_88 = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_8c = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_90 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  ppTVar6 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppTVar6) {
    iVar10 = 0;
  }
  else {
    iVar8 = 0;
    iVar10 = 0;
    local_78 = 0;
    local_80 = this;
    do {
      pTVar1 = ppTVar6[local_78];
      std::__cxx11::string::string
                ((string *)&local_70,(pTVar1->name_)._M_dataplus._M_p,(allocator *)&local_50);
      pTVar1->should_run_ = false;
      ppTVar7 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar7) {
        uVar9 = 0;
        do {
          pTVar2 = ppTVar7[uVar9];
          std::__cxx11::string::string
                    ((string *)&local_50,(pTVar2->name_)._M_dataplus._M_p,&local_91);
          local_84 = iVar10;
          bVar3 = UnitTestOptions::MatchesFilter(&local_70,"DISABLED_*:*/DISABLED_*");
          bVar4 = true;
          if (!bVar3) {
            bVar4 = UnitTestOptions::MatchesFilter(&local_50,"DISABLED_*:*/DISABLED_*");
          }
          pTVar2->is_disabled_ = bVar4;
          bVar5 = UnitTestOptions::FilterMatchesTest(&local_70,&local_50);
          pTVar2->matches_filter_ = bVar5;
          bVar5 = (bool)((bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests) & bVar5);
          bVar3 = bVar5;
          if ((local_88 != IGNORE_SHARDING_PROTOCOL) && (bVar5 != false)) {
            bVar3 = iVar8 % local_8c == local_90;
          }
          pTVar2->should_run_ = bVar3;
          pTVar1->should_run_ = (bool)(pTVar1->should_run_ | bVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          uVar9 = uVar9 + 1;
          iVar8 = iVar8 + (uint)bVar5;
          iVar10 = local_84 + (uint)bVar3;
          ppTVar7 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar7 >>
                                3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ppTVar6 = (local_80->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_78 = local_78 + 1;
    } while (local_78 <
             (ulong)((long)(local_80->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar6 >> 3));
  }
  return iVar10;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const std::string &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}